

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int ShouldCompress(uint8_t *input,size_t input_size,size_t num_literals)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined4 uVar11;
  undefined1 auVar10 [16];
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  uint32_t literal_histo [256];
  int local_428 [256];
  
  auVar8._8_4_ = (int)(input_size >> 0x20);
  auVar8._0_8_ = input_size;
  auVar8._12_4_ = 0x45300000;
  dVar13 = (auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)input_size) - 4503599627370496.0);
  auVar9._8_4_ = (int)(num_literals >> 0x20);
  auVar9._0_8_ = num_literals;
  auVar9._12_4_ = 0x45300000;
  uVar1 = 1;
  if (dVar13 * 0.98 <=
      (auVar9._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)num_literals) - 4503599627370496.0)) {
    memset(local_428,0,0x400);
    if (input_size != 0) {
      uVar2 = 0;
      do {
        local_428[input[uVar2]] = local_428[input[uVar2]] + 1;
        uVar2 = uVar2 + 0x2b;
      } while (uVar2 < input_size);
    }
    dVar12 = 0.0;
    uVar5 = 0xfffffffffffffff8;
    uVar2 = 0;
    do {
      uVar3 = (ulong)*(uint *)((long)local_428 + uVar5 + 8);
      if (uVar3 < 0x100) {
        dVar7 = kLog2Table[uVar3];
      }
      else {
        dVar7 = log2((double)uVar3);
      }
      uVar4 = (ulong)*(uint *)((long)local_428 + uVar5 + 0xc);
      if (uVar4 < 0x100) {
        dVar6 = kLog2Table[uVar4];
      }
      else {
        dVar6 = log2((double)uVar4);
      }
      uVar2 = uVar2 + uVar3 + uVar4;
      dVar12 = (dVar12 - (double)uVar3 * dVar7) - (double)uVar4 * dVar6;
      uVar5 = uVar5 + 8;
    } while (uVar5 < 0x3f8);
    uVar11 = (undefined4)(uVar2 >> 0x20);
    if (uVar2 != 0) {
      auVar10._8_4_ = uVar11;
      auVar10._0_8_ = uVar2;
      auVar10._12_4_ = 0x45300000;
      dVar7 = (auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
      if (uVar2 < 0x100) {
        dVar6 = kLog2Table[uVar2];
      }
      else {
        dVar6 = log2(dVar7);
      }
      dVar12 = dVar12 + dVar7 * dVar6;
    }
    auVar14._8_4_ = uVar11;
    auVar14._0_8_ = uVar2;
    auVar14._12_4_ = 0x45300000;
    dVar7 = (auVar14._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    if (dVar7 <= dVar12) {
      dVar7 = dVar12;
    }
    uVar1 = (uint)(dVar7 < (dVar13 * 8.0 * 0.98) / 43.0);
  }
  return uVar1;
}

Assistant:

static BROTLI_BOOL ShouldCompress(
    const uint8_t* data, const size_t mask, const uint64_t last_flush_pos,
    const size_t bytes, const size_t num_literals, const size_t num_commands) {
  /* TODO: find more precise minimal block overhead. */
  if (bytes <= 2) return BROTLI_FALSE;
  if (num_commands < (bytes >> 8) + 2) {
    if ((double)num_literals > 0.99 * (double)bytes) {
      uint32_t literal_histo[256] = { 0 };
      static const uint32_t kSampleRate = 13;
      static const double kMinEntropy = 7.92;
      const double bit_cost_threshold =
          (double)bytes * kMinEntropy / kSampleRate;
      size_t t = (bytes + kSampleRate - 1) / kSampleRate;
      uint32_t pos = (uint32_t)last_flush_pos;
      size_t i;
      for (i = 0; i < t; i++) {
        ++literal_histo[data[pos & mask]];
        pos += kSampleRate;
      }
      if (BitsEntropy(literal_histo, 256) > bit_cost_threshold) {
        return BROTLI_FALSE;
      }
    }
  }
  return BROTLI_TRUE;
}